

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall re2::BitState::GrowStack(BitState *this)

{
  Job *__src;
  Job *__dest;
  int iVar1;
  ulong uVar2;
  int iVar3;
  LogMessageFatal LStack_1a8;
  
  iVar3 = this->maxjob_;
  iVar1 = iVar3 * 2;
  this->maxjob_ = iVar1;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (long)iVar3) {
    uVar2 = (long)iVar3 << 5;
  }
  __dest = (Job *)operator_new__(uVar2);
  __src = this->job_;
  iVar3 = this->njob_;
  memmove(__dest,__src,(long)iVar3 << 4);
  if (__src != (Job *)0x0) {
    operator_delete__(__src);
    iVar3 = this->njob_;
    iVar1 = this->maxjob_;
  }
  this->job_ = __dest;
  if (iVar1 <= iVar3) {
    LogMessageFatal::LogMessageFatal
              (&LStack_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc",
               0x71);
    std::operator<<((ostream *)&LStack_1a8.super_LogMessage.str_,"Job stack overflow.");
    LogMessageFatal::~LogMessageFatal(&LStack_1a8);
  }
  return iVar3 < iVar1;
}

Assistant:

bool BitState::GrowStack() {
  // VLOG(0) << "Reallocate.";
  maxjob_ *= 2;
  Job* newjob = new Job[maxjob_];
  memmove(newjob, job_, njob_*sizeof job_[0]);
  delete[] job_;
  job_ = newjob;
  if (njob_ >= maxjob_) {
    LOG(DFATAL) << "Job stack overflow.";
    return false;
  }
  return true;
}